

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall
Catch::anon_unknown_26::printSummaryRow
          (anon_unknown_26 *this,ostream *stream,ColourImpl *colour,StringRef label,
          vector<Catch::(anonymous_namespace)::SummaryColumn,_std::allocator<Catch::(anonymous_namespace)::SummaryColumn>_>
          *cols,size_t row)

{
  string *psVar1;
  bool bVar2;
  ostream *poVar3;
  string *psVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  ColourGuard local_68;
  ColourImpl *local_58;
  ColourGuard local_50;
  ColourImpl *local_40;
  char *local_38;
  
  local_38 = label.m_start;
  psVar4 = *(string **)label.m_size;
  psVar1 = (string *)((undefined8 *)label.m_size)[1];
  local_58 = (ColourImpl *)stream;
  local_40 = colour;
  do {
    if (psVar4 == psVar1) {
      std::operator<<((ostream *)this,'\n');
      return;
    }
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            (*(long *)(psVar4 + 0x30) + (long)cols * 0x20);
    if (*(long *)(psVar4 + 8) == 0) {
      poVar3 = (ostream *)std::ostream::write((char *)this,(long)local_40);
      std::operator<<(poVar3,": ");
      bVar2 = std::operator!=(__lhs,"0");
      if (!bVar2) {
        local_68.m_colourImpl = local_58;
        local_68.m_code = BrightYellow;
        local_68.m_engaged = false;
        ColourImpl::ColourGuard::engageImpl(&local_68,(ostream *)this);
        std::operator<<((ostream *)this,"- none -");
        goto LAB_0015fce8;
      }
      std::operator<<((ostream *)this,(string *)__lhs);
    }
    else {
      bVar2 = std::operator!=(__lhs,"0");
      if (bVar2) {
        local_68.m_colourImpl = local_58;
        local_68.m_code = FileName;
        local_68.m_engaged = false;
        ColourImpl::ColourGuard::engageImpl(&local_68,(ostream *)this);
        poVar3 = std::operator<<((ostream *)this," | ");
        local_50.m_code = *(Code *)(psVar4 + 0x20);
        local_50.m_colourImpl = local_58;
        local_50.m_engaged = false;
        ColourImpl::ColourGuard::engageImpl(&local_50,poVar3);
        poVar3 = std::operator<<(poVar3,(string *)__lhs);
        poVar3 = std::operator<<(poVar3,' ');
        std::operator<<(poVar3,psVar4);
        ColourImpl::ColourGuard::~ColourGuard(&local_50);
LAB_0015fce8:
        ColourImpl::ColourGuard::~ColourGuard(&local_68);
      }
    }
    psVar4 = psVar4 + 0x48;
  } while( true );
}

Assistant:

void printSummaryRow( std::ostream& stream,
                              ColourImpl& colour,
                              StringRef label,
                              std::vector<SummaryColumn> const& cols,
                              std::size_t row ) {
            for ( auto const& col : cols ) {
                auto const& value = col.getRow( row );
                auto const& suffix = col.getSuffix();
                if ( suffix.empty() ) {
                    stream << label << ": ";
                    if ( value != "0" ) {
                        stream << value;
                    } else {
                        stream << colour.guardColour( Colour::Warning )
                               << "- none -";
                    }
                } else if ( value != "0" ) {
                    stream << colour.guardColour( Colour::LightGrey ) << " | "
                           << colour.guardColour( col.getColour() ) << value
                           << ' ' << suffix;
                }
            }
            stream << '\n';
        }